

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O2

HeaderSize HPack::header_size(HttpHeader *header)

{
  pointer pHVar1;
  HeaderSize HVar2;
  HeaderSize HVar3;
  HeaderField *field;
  pointer entry;
  uint uVar4;
  
  entry = (header->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
          _M_impl.super__Vector_impl_data._M_start;
  pHVar1 = (header->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  uVar4 = 0;
  while( true ) {
    if (entry == pHVar1) {
      return (HeaderSize)((ulong)uVar4 << 0x20 | 0xaaaaaa01);
    }
    HVar2 = entry_size(entry);
    if (((ulong)HVar2 & 1) == 0) break;
    if (~uVar4 < HVar2.second) {
      HVar3.first = false;
      HVar3._1_3_ = 0xaaaaaa;
      HVar3.second = 0;
      return HVar3;
    }
    uVar4 = uVar4 + HVar2.second;
    entry = entry + 1;
  }
  HVar2.first = false;
  HVar2._1_3_ = 0xaaaaaa;
  HVar2.second = 0;
  return HVar2;
}

Assistant:

HeaderSize header_size(const HttpHeader &header)
{
    HeaderSize size(true, 0);
    for (const HeaderField &field : header) {
        HeaderSize delta = entry_size(field);
        if (!delta.first)
            return HeaderSize();
        if (std::numeric_limits<quint32>::max() - size.second < delta.second)
            return HeaderSize();
        size.second += delta.second;
    }

    return size;
}